

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::Insert
          (PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *this,
          float_na_equal value)

{
  long lVar1;
  bool bVar2;
  primitive_dictionary_entry_t *this_00;
  float_na_equal *in_RDI;
  undefined4 in_XMM0_Da;
  PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *unaff_retaddr;
  primitive_dictionary_entry_t *entry;
  float_na_equal *src_value;
  undefined4 in_stack_fffffffffffffff8;
  
  if (((byte)in_RDI[0x98] & 1) == 0) {
    src_value = in_RDI;
    this_00 = Lookup(unaff_retaddr,(float_na_equal *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff8))
    ;
    bVar2 = primitive_dictionary_entry_t::IsEmpty(this_00);
    if (bVar2) {
      if ((*(ulong *)(in_RDI + 8) < *(long *)(in_RDI + 0x10) + 1U) ||
         (bVar2 = AddToTarget<duckdb::float_na_equal,_0>
                            ((PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>
                              *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff8),src_value), !bVar2))
      {
        in_RDI[0x98] = (float_na_equal)0x1;
      }
      else {
        *(undefined4 *)this_00 = in_XMM0_Da;
        lVar1 = *(long *)(in_RDI + 0x10);
        *(long *)(in_RDI + 0x10) = lVar1 + 1;
        this_00->index = (uint32_t)lVar1;
      }
    }
  }
  return;
}

Assistant:

void Insert(SRC value) {
		if (full) {
			return;
		}
		auto &entry = Lookup(value);
		if (entry.IsEmpty()) {
			if (size + 1 > maximum_size || !AddToTarget(value)) {
				full = true;
				return;
			}
			entry.value = value;
			entry.index = size++;
		}
	}